

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  ostream *poVar1;
  
  if ((this->itMessage)._M_current !=
      (this->messages->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<(this->stream," \'");
    poVar1 = std::operator<<(poVar1,(string *)&((this->itMessage)._M_current)->message);
    std::operator<<(poVar1,'\'');
    (this->itMessage)._M_current = (this->itMessage)._M_current + 1;
  }
  return;
}

Assistant:

void printMessage() {
        if (itMessage != messages.end()) {
            stream << " '" << itMessage->message << '\'';
            ++itMessage;
        }
    }